

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O3

int sat_solver_decision(sat_solver *s,lit l)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  lit *plVar4;
  int iVar5;
  long lVar6;
  
  iVar1 = s->qtail;
  if (iVar1 != s->qhead) {
    __assert_fail("s->qtail == s->qhead",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.c"
                  ,0x212,"int sat_solver_decision(sat_solver *, lit)");
  }
  lVar6 = (long)(l >> 1);
  if (s->assigns[lVar6] == '\x03') {
    uVar2 = (s->trail_lim).size;
    if (uVar2 == (s->trail_lim).cap) {
      iVar5 = (uVar2 >> 1) * 3;
      if ((int)uVar2 < 4) {
        iVar5 = uVar2 * 2;
      }
      piVar3 = (s->trail_lim).ptr;
      if (piVar3 == (int *)0x0) {
        piVar3 = (int *)malloc((long)iVar5 << 2);
      }
      else {
        piVar3 = (int *)realloc(piVar3,(long)iVar5 << 2);
      }
      (s->trail_lim).ptr = piVar3;
      if (piVar3 == (int *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)(s->trail_lim).cap * 9.5367431640625e-07,(double)iVar5 * 9.5367431640625e-07)
        ;
        fflush(_stdout);
      }
      (s->trail_lim).cap = iVar5;
      uVar2 = (s->trail_lim).size;
    }
    (s->trail_lim).size = uVar2 + 1;
    (s->trail_lim).ptr[(int)uVar2] = iVar1;
    if (s->pFreqs[lVar6] == '\0') {
      s->pFreqs[lVar6] = '\x01';
    }
    plVar4 = (lit *)s->assigns;
    if (*(char *)((long)plVar4 + lVar6) == '\x03') {
      *(byte *)((long)plVar4 + lVar6) = (byte)l & 1;
      s->levels[lVar6] = (s->trail_lim).size;
      s->reasons[lVar6] = 0;
      plVar4 = s->trail;
      iVar1 = s->qtail;
      s->qtail = iVar1 + 1;
      plVar4[iVar1] = l;
    }
    return (int)plVar4;
  }
  __assert_fail("var_value(s, lit_var(l)) == varX",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.c"
                ,0x213,"int sat_solver_decision(sat_solver *, lit)");
}

Assistant:

static inline int sat_solver_decision(sat_solver* s, lit l){
    assert(s->qtail == s->qhead);
    assert(var_value(s, lit_var(l)) == varX);
#ifdef VERBOSEDEBUG
    printf(L_IND"assume("L_LIT")  ", L_ind, L_lit(l));
    printf( "act = %.20f\n", s->activity[lit_var(l)] );
#endif
    veci_push(&s->trail_lim,s->qtail);
    return sat_solver_enqueue(s,l,0);
}